

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O3

void __thiscall
CVIterator_Preincrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>::
TestBody(CVIterator_Preincrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>
         *this)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  cseq_int *cv;
  char *pcVar4;
  _List_node_base *p_Var5;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  iterator_base<false> local_40;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>).
       cv_.size_;
  local_40.chunk_it_._M_node._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_30,"this->cv_.size ()","4U",(unsigned_long *)&local_50,
             (uint *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xcf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  cv = &(this->super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>)
        .cv_;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  p_Var5 = (cv->chunks_).
           super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_30 = (undefined1  [8])p_Var5;
  piVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]((chunk *)(p_Var5 + 1),0);
  local_40.chunk_it_._M_node._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_50,"*it","2",piVar3,(int *)&local_40);
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd2,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,local_40.chunk_it_._M_node._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,
                                     local_40.chunk_it_._M_node._0_4_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  bVar1 = (_List_node_base *)0x1 < p_Var5[1]._M_next;
  bVar2 = !bVar1;
  if (bVar2) {
    p_Var5 = p_Var5->_M_next;
    local_30 = (undefined1  [8])p_Var5;
  }
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)!bVar2;
  piVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)(p_Var5 + 1),(ulong)bVar1);
  local_40.chunk_it_._M_node._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_50,"*it","3",piVar3,(int *)&local_40);
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd4,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,local_40.chunk_it_._M_node._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,
                                     local_40.chunk_it_._M_node._0_4_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_28 + 1);
  if (((_List_node_base *)((long)local_30 + 0x10))->_M_next <= local_28) {
    local_30 = (undefined1  [8])*(_List_node_base **)local_30;
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  piVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_30 + 0x10),(size_t)local_28);
  local_40.chunk_it_._M_node._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_50,"*it","5",piVar3,(int *)&local_40);
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd6,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,local_40.chunk_it_._M_node._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,
                                     local_40.chunk_it_._M_node._0_4_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_28->_M_dataplus + 1);
  if (((_List_node_base *)((long)local_30 + 0x10))->_M_next <= local_28) {
    local_30 = (undefined1  [8])*(_List_node_base **)local_30;
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  piVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_30 + 0x10),(size_t)local_28);
  local_40.chunk_it_._M_node._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_50,"*it","7",piVar3,(int *)&local_40);
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,local_40.chunk_it_._M_node._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,
                                     local_40.chunk_it_._M_node._0_4_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_28->_M_dataplus + 1);
  if (((_List_node_base *)((long)local_30 + 0x10))->_M_next <= local_28) {
    local_30 = (undefined1  [8])*(_List_node_base **)local_30;
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  pstore::chunked_sequence<int,2ul,4ul,4ul>::
  end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
            ((chunked_sequence<int,2ul,4ul,4ul> *)&local_40,cv);
  testing::internal::
  CmpHelperEQ<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
            ((internal *)&local_50,"it","this->cv_.end ()",(iterator_base<true> *)local_30,&local_40
            );
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xda,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,local_40.chunk_it_._M_node._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.chunk_it_._M_node._4_4_,
                                     local_40.chunk_it_._M_node._0_4_) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TYPED_TEST (CVIterator, Preincrement) {
    EXPECT_EQ (this->cv_.size (), 4U);

    TypeParam it = this->cv_.begin ();
    EXPECT_EQ (*it, 2);
    ++it;
    EXPECT_EQ (*it, 3);
    ++it;
    EXPECT_EQ (*it, 5);
    ++it;
    EXPECT_EQ (*it, 7);
    ++it;
    EXPECT_EQ (it, this->cv_.end ());
}